

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O2

int archive_compressor_bzip2_options(archive_write_filter *f,char *key,char *value)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  puVar2 = (uint *)f->data;
  iVar3 = strcmp(key,"compression-level");
  iVar4 = -0x14;
  if ((value != (char *)0x0) && (iVar3 == 0)) {
    bVar1 = *value - 0x30;
    if ((bVar1 < 10) && (value[1] == '\0')) {
      uVar5 = 1;
      if (*value != '0') {
        uVar5 = (uint)bVar1;
      }
      *puVar2 = uVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_compressor_bzip2_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		/* Make '0' be a synonym for '1'. */
		/* This way, bzip2 compressor supports the same 0..9
		 * range of levels as gzip. */
		if (data->compression_level < 1)
			data->compression_level = 1;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}